

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::BitAggState<unsigned_char>,unsigned_char,duckdb::BitStringAggOperation>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  FunctionData *pFVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uchar *input_00;
  ulong uVar11;
  idx_t iVar12;
  ulong uVar13;
  ulong uVar14;
  AggregateUnaryInput input_data;
  AggregateUnaryInput local_90;
  undefined1 local_78 [32];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  if (*input == (Vector)0x0) {
    lVar1 = *(long *)(input + 0x20);
    FlatVector::VerifyFlatVector(input);
    local_78._16_8_ = 0;
    if (0x3f < count + 0x3f) {
      uVar11 = 0;
      uVar10 = 0;
      uVar13 = 0;
      local_78._0_8_ = aggr_input_data;
      local_78._8_8_ = input + 0x28;
      do {
        lVar2 = *(long *)(input + 0x28);
        if (lVar2 == 0) {
          uVar14 = uVar13 + 0x40;
          if (count <= uVar13 + 0x40) {
            uVar14 = count;
          }
joined_r0x004b532d:
          while (uVar9 = uVar11, uVar6 = uVar11, uVar7 = local_78._16_8_, uVar11 < uVar14) {
            BitStringAggOperation::
            Operation<unsigned_char,duckdb::BitAggState<unsigned_char>,duckdb::BitStringAggOperation>
                      ((BitAggState<unsigned_char> *)state,(uchar *)(uVar11 + lVar1),
                       (AggregateUnaryInput *)local_78);
            uVar11 = local_78._16_8_ + 1;
            local_78._16_8_ = uVar11;
          }
        }
        else {
          uVar3 = *(ulong *)(lVar2 + uVar10 * 8);
          uVar14 = uVar13 + 0x40;
          if (count <= uVar13 + 0x40) {
            uVar14 = count;
          }
          if (uVar3 == 0xffffffffffffffff) goto joined_r0x004b532d;
          uVar9 = uVar14;
          uVar6 = uVar14;
          uVar7 = uVar14;
          uVar8 = uVar13;
          uVar5 = local_78._16_8_;
          if (uVar3 != 0) {
            while (local_78._16_8_ = uVar8, uVar9 = local_78._16_8_, uVar6 = uVar11, uVar7 = uVar5,
                  (ulong)local_78._16_8_ < uVar14) {
              if ((uVar3 >> ((ulong)(uint)((int)local_78._16_8_ - (int)uVar13) & 0x3f) & 1) != 0) {
                input_00 = (uchar *)(local_78._16_8_ + lVar1);
                local_78._16_8_ = uVar5;
                BitStringAggOperation::
                Operation<unsigned_char,duckdb::BitAggState<unsigned_char>,duckdb::BitStringAggOperation>
                          ((BitAggState<unsigned_char> *)state,input_00,
                           (AggregateUnaryInput *)local_78);
              }
              uVar11 = local_78._16_8_ + 1;
              uVar5 = uVar11;
              uVar8 = uVar11;
            }
          }
        }
        local_78._16_8_ = uVar7;
        uVar11 = uVar6;
        uVar10 = uVar10 + 1;
        uVar13 = uVar9;
      } while (uVar10 != count + 0x3f >> 6);
    }
  }
  else if (*input == (Vector)0x2) {
    if ((*(byte **)(input + 0x28) == (byte *)0x0) || ((**(byte **)(input + 0x28) & 1) != 0)) {
      local_78._8_8_ = input + 0x28;
      local_78._16_8_ = 0;
      local_78._0_8_ = aggr_input_data;
      BitStringAggOperation::
      Operation<unsigned_char,duckdb::BitAggState<unsigned_char>,duckdb::BitStringAggOperation>
                ((BitAggState<unsigned_char> *)state,*(uchar **)(input + 0x20),
                 (AggregateUnaryInput *)local_78);
    }
  }
  else {
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_78);
    duckdb::Vector::ToUnifiedFormat((ulong)input,(UnifiedVectorFormat *)count);
    local_90.input_mask = (ValidityMask *)(local_78 + 0x10);
    local_90.input = aggr_input_data;
    if (local_78._16_8_ == 0) {
      if (count != 0) {
        pFVar4 = ((optional_ptr<duckdb::FunctionData,_true> *)local_78._0_8_)->ptr;
        iVar12 = 0;
        do {
          local_90.input_idx = iVar12;
          if (pFVar4 != (FunctionData *)0x0) {
            local_90.input_idx = (idx_t)*(uint *)(pFVar4 + iVar12 * 4);
          }
          BitStringAggOperation::
          Operation<unsigned_char,duckdb::BitAggState<unsigned_char>,duckdb::BitStringAggOperation>
                    ((BitAggState<unsigned_char> *)state,
                     (uchar *)((long)&((TemplatedValidityMask<unsigned_long> *)local_78._8_8_)->
                                      validity_mask + local_90.input_idx),&local_90);
          iVar12 = iVar12 + 1;
        } while (count != iVar12);
      }
    }
    else if (count != 0) {
      pFVar4 = ((optional_ptr<duckdb::FunctionData,_true> *)local_78._0_8_)->ptr;
      iVar12 = 0;
      do {
        local_90.input_idx = iVar12;
        if (pFVar4 != (FunctionData *)0x0) {
          local_90.input_idx = (idx_t)*(uint *)(pFVar4 + iVar12 * 4);
        }
        if ((local_78._16_8_ == 0) ||
           ((*(ulong *)(local_78._16_8_ + (local_90.input_idx >> 6) * 8) >>
             (local_90.input_idx & 0x3f) & 1) != 0)) {
          BitStringAggOperation::
          Operation<unsigned_char,duckdb::BitAggState<unsigned_char>,duckdb::BitStringAggOperation>
                    ((BitAggState<unsigned_char> *)state,
                     (uchar *)((long)&((TemplatedValidityMask<unsigned_long> *)local_78._8_8_)->
                                      validity_mask + local_90.input_idx),&local_90);
        }
        iVar12 = iVar12 + 1;
      } while (count != iVar12);
    }
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}